

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::insert
          (subscriber_adaptive_container_t *this,subscriber_info_t info)

{
  bool bVar1;
  size_type sVar2;
  subscriber_adaptive_container_t *this_local;
  
  bVar1 = is_vector(this);
  if ((bVar1) &&
     (sVar2 = std::
              vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
              ::size(&this->m_vector), sVar2 == 0x20)) {
    switch_storage_to_map(this);
  }
  bVar1 = is_vector(this);
  if (bVar1) {
    insert_to_vector(this,&info);
  }
  else {
    insert_to_map(this,&info);
  }
  return;
}

Assistant:

void
	insert( subscriber_info_t info )
		{
			if( is_vector() )
				{
					if( m_vector.size() == size_limits::switch_to_map )
						switch_storage_to_map();
				}

			if( is_vector() )
				insert_to_vector( std::move( info ) );
			else
				insert_to_map( std::move( info ) );
		}